

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::plus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  ulong uVar1;
  double dVar2;
  pointer pvVar3;
  long lVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_88;
  pair<double,_double> local_70;
  Persistence_landscape *local_60;
  Persistence_landscape *local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_48;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar8 = ((long)(__return_storage_ptr__->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish >> 3) * -0x5555555555555555;
  __return_storage_ptr__->number_of_functions_for_vectorization = sVar8;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = sVar8;
  uVar9 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  lVar16 = (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar17 = lVar16 * -0x5555555555555555;
  if (uVar17 <= uVar9 && uVar9 + lVar16 * 0x5555555555555555 != 0) {
    uVar17 = uVar9;
  }
  local_60 = land1;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&local_48,uVar17,(allocator_type *)&local_88);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&local_48);
  uVar17 = 0;
  local_58 = __return_storage_ptr__;
  do {
    uVar10 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
    uVar15 = ((long)(local_60->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_60->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar9 = uVar10;
    if (uVar15 < uVar10) {
      uVar9 = uVar15;
    }
    if (uVar17 == uVar9) {
      if (uVar15 < uVar10) {
        while( true ) {
          uVar9 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
          lVar16 = (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar17 = lVar16 * -0x5555555555555555;
          if (uVar17 <= uVar9 && uVar9 + lVar16 * 0x5555555555555555 != 0) {
            uVar17 = uVar9;
          }
          if (uVar15 == uVar17) break;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          vector(&local_88,
                 (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 (*(long *)this + uVar15 * 0x18));
          lVar16 = *(long *)(*(long *)this + uVar15 * 0x18);
          lVar12 = *(long *)(*(long *)this + 8 + uVar15 * 0x18) - lVar16;
          if (lVar12 != 0) {
            lVar12 = lVar12 >> 4;
            lVar14 = 8;
            do {
              dVar2 = *(double *)(lVar16 + lVar14);
              *(undefined8 *)
               ((long)local_88.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8) =
                   *(undefined8 *)(lVar16 + -8 + lVar14);
              *(double *)
               ((long)&(local_88.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar14) = dVar2 + 0.0;
              lVar14 = lVar14 + 0x10;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          pvVar3 = (__return_storage_ptr__->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = *(pointer *)
                    &pvVar3[uVar15].
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl;
          ppVar6 = *(pointer *)
                    ((long)&pvVar3[uVar15].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8);
          ppVar7 = *(pointer *)
                    ((long)&pvVar3[uVar15].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 0x10);
          *(pointer *)
           &pvVar3[uVar15].
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl = local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&pvVar3[uVar15].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 8) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&pvVar3[uVar15].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 0x10) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar5;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
          if (ppVar5 != (pointer)0x0) {
            operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
          }
          uVar15 = uVar15 + 1;
        }
      }
      if ((ulong)(*(long *)(this + 8) - *(long *)this) <
          (ulong)((long)(local_60->land).
                        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_60->land).
                       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
        uVar17 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
        while( true ) {
          uVar10 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
          pvVar3 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3;
          uVar9 = lVar16 * -0x5555555555555555;
          if (uVar9 <= uVar10 && uVar10 + lVar16 * 0x5555555555555555 != 0) {
            uVar9 = uVar10;
          }
          if (uVar17 == uVar9) break;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          vector(&local_88,pvVar3 + uVar17);
          pvVar3 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = *(long *)&pvVar3[uVar17].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          lVar12 = (long)*(pointer *)
                          ((long)&pvVar3[uVar17].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar16;
          if (lVar12 != 0) {
            lVar12 = lVar12 >> 4;
            lVar14 = 8;
            do {
              dVar2 = *(double *)(lVar16 + lVar14);
              *(undefined8 *)
               ((long)local_88.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8) =
                   *(undefined8 *)(lVar16 + -8 + lVar14);
              *(double *)
               ((long)&(local_88.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar14) = dVar2 + 0.0;
              lVar14 = lVar14 + 0x10;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          pvVar3 = (__return_storage_ptr__->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = *(pointer *)
                    &pvVar3[uVar17].
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl;
          ppVar6 = *(pointer *)
                    ((long)&pvVar3[uVar17].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8);
          ppVar7 = *(pointer *)
                    ((long)&pvVar3[uVar17].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 0x10);
          *(pointer *)
           &pvVar3[uVar17].
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl = local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&pvVar3[uVar17].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 8) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&pvVar3[uVar17].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 0x10) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar5;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
          if (ppVar5 != (pointer)0x0) {
            operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
          }
          uVar17 = uVar17 + 1;
        }
      }
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::~vector(&local_48);
      return __return_storage_ptr__;
    }
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar16 = *(long *)this;
    lVar12 = *(long *)(lVar16 + uVar17 * 0x18);
    local_50 = uVar17;
    if ((ulong)(*(long *)(lVar16 + 8 + uVar17 * 0x18) - lVar12) < 0x11) {
      uVar9 = 0;
      uVar10 = 0;
    }
    else {
      plVar11 = (long *)(lVar16 + uVar17 * 0x18);
      uVar15 = 1;
      uVar10 = 0;
      uVar9 = 0;
      do {
        uVar1 = uVar9 + 1;
        while( true ) {
          uVar13 = uVar15;
          pvVar3 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = *(long *)&pvVar3[uVar17].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar3[uVar17].
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl + 8) - lVar16 >> 4) <= uVar1) goto LAB_00107aad;
          pvVar3 = pvVar3 + uVar17;
          lVar14 = uVar10 * 0x10;
          dVar2 = *(double *)(lVar12 + lVar14);
          lVar12 = uVar9 * 0x10;
          dVar19 = *(double *)(lVar16 + lVar12);
          if (dVar19 <= dVar2) break;
          lVar16 = *(long *)&(pvVar3->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl;
          dVar2 = *(double *)(lVar16 + -0x10 + lVar12);
          dVar19 = *(double *)(lVar16 + -8 + lVar12);
          local_70.first = *(double *)(*plVar11 + lVar14);
          dVar18 = (*(double *)(lVar16 + 8 + lVar12) - dVar19) /
                   (*(double *)(lVar16 + lVar12) - dVar2);
          local_70.second =
               dVar18 * local_70.first + (dVar19 - dVar2 * dVar18) +
               *(double *)(*plVar11 + 8 + lVar14);
          if (local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          plVar11 = (long *)(*(long *)this + uVar17 * 0x18);
          lVar12 = *plVar11;
          uVar15 = uVar13 + 1;
          uVar10 = uVar13;
          if ((ulong)(plVar11[1] - lVar12 >> 4) <= uVar13 + 1) goto LAB_00107aad;
        }
        if (dVar2 <= dVar19) {
          if ((dVar2 == dVar19) && (!NAN(dVar2) && !NAN(dVar19))) {
            lVar16 = *(long *)&(pvVar3->
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               )._M_impl;
            local_70.second = *(double *)(*plVar11 + 8 + lVar14) + *(double *)(lVar16 + 8 + lVar12);
            local_70.first = *(double *)(lVar16 + lVar12);
            if (local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_88,
                         (iterator)
                         local_88.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_70);
              uVar9 = uVar1;
              uVar10 = uVar13;
            }
            else {
              (local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
              (local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              uVar9 = uVar1;
              uVar10 = uVar13;
            }
          }
        }
        else {
          lVar16 = *(long *)&(pvVar3->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl;
          lVar4 = *plVar11;
          dVar2 = *(double *)(lVar4 + 8 + lVar14);
          local_70.first = *(double *)(lVar16 + lVar12);
          dVar19 = (*(double *)(lVar4 + -8 + lVar14) - dVar2) /
                   (*(double *)(lVar4 + -0x10 + lVar14) - *(double *)(lVar4 + lVar14));
          local_70.second =
               dVar19 * local_70.first + (dVar2 - *(double *)(lVar4 + lVar14) * dVar19) +
               *(double *)(lVar16 + 8 + lVar12);
          if (local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
            uVar9 = uVar1;
          }
          else {
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            uVar9 = uVar1;
          }
        }
        uVar15 = uVar10 + 1;
        plVar11 = (long *)(*(long *)this + uVar17 * 0x18);
        lVar12 = *plVar11;
      } while (uVar15 < (ulong)(plVar11[1] - lVar12 >> 4));
    }
LAB_00107aad:
    uVar15 = uVar10 + 1;
    lVar16 = *(long *)this;
    if (uVar15 < (ulong)(*(long *)(lVar16 + 8 + uVar17 * 0x18) - *(long *)(lVar16 + uVar17 * 0x18)
                        >> 4)) {
      plVar11 = (long *)(lVar16 + uVar17 * 0x18);
      uVar10 = uVar10 << 4 | 8;
      do {
        pvVar3 = (local_60->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar9 + 1 <
            (ulong)((long)*(pointer *)
                           ((long)&pvVar3[uVar17].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) -
                    *(long *)&pvVar3[uVar17].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl >> 4)) break;
        local_70.second = *(double *)(*plVar11 + uVar10) + 0.0;
        local_70.first = *(double *)(*plVar11 + -8 + uVar10);
        if (local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        plVar11 = (long *)(*(long *)this + uVar17 * 0x18);
        uVar15 = uVar15 + 1;
        uVar10 = uVar10 + 0x10;
      } while (uVar15 < (ulong)(plVar11[1] - *plVar11 >> 4));
    }
    if ((ulong)(*(long *)(*(long *)this + 8 + uVar17 * 0x18) -
                *(long *)(*(long *)this + uVar17 * 0x18) >> 4) <= uVar15) {
      uVar10 = uVar9 << 4 | 8;
      do {
        uVar9 = uVar9 + 1;
        pvVar3 = (local_60->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar3[uVar17].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) -
                    *(long *)&pvVar3[uVar17].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl >> 4) <= uVar9) break;
        lVar16 = *(long *)&pvVar3[uVar17].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl;
        local_70.second = *(double *)(lVar16 + uVar10) + 0.0;
        local_70.first = *(double *)(lVar16 + -8 + uVar10);
        if (local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar10 = uVar10 + 0x10;
      } while ((ulong)(*(long *)(*(long *)this + 8 + uVar17 * 0x18) -
                       *(long *)(*(long *)this + uVar17 * 0x18) >> 4) <= uVar15);
    }
    __return_storage_ptr__ = local_58;
    local_70.first = 2147483647.0;
    local_70.second = 0.0;
    if (local_88.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_70);
    }
    else {
      (local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = 2147483647.0;
      (local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_88.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pvVar3 = (__return_storage_ptr__->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              &pvVar3[uVar17].
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl;
    ppVar6 = *(pointer *)
              ((long)&pvVar3[uVar17].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 8);
    ppVar7 = *(pointer *)
              ((long)&pvVar3[uVar17].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 0x10);
    *(pointer *)
     &pvVar3[uVar17].
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl = local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar3[uVar17].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 8) =
         local_88.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&pvVar3[uVar17].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 0x10) =
         local_88.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = ppVar5;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar6;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7;
    if (ppVar5 != (pointer)0x0) {
      operator_delete(ppVar5,(long)ppVar7 - (long)ppVar5);
    }
    uVar17 = local_50 + 1;
  } while( true );
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}